

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O3

void __thiscall
Kernel::FormulaUnitTransformer::transform(FormulaUnitTransformer *this,UnitList **units)

{
  UnitList *pUVar1;
  Unit *pUVar2;
  int iVar3;
  List<Kernel::Unit_*> **ppLVar4;
  undefined4 extraout_var;
  List<Kernel::Unit_*> **ppLVar6;
  void **head;
  UnitList *pUVar7;
  UnitList *pUVar8;
  bool bVar9;
  Unit *pUVar5;
  
  if (*units != (UnitList *)0x0) {
    bVar9 = true;
    ppLVar4 = (List<Kernel::Unit_*> **)&DAT_00000008;
    pUVar8 = (UnitList *)0x0;
    pUVar7 = (UnitList *)0x0;
    do {
      if (bVar9) {
        ppLVar4 = units;
        pUVar7 = pUVar8;
      }
      pUVar8 = pUVar7;
      pUVar1 = *ppLVar4;
      pUVar2 = pUVar1->_head;
      pUVar7 = pUVar1;
      if ((pUVar2->field_0x4 & 1) != 0) {
        iVar3 = (*this->_vptr_FormulaUnitTransformer[2])(this,pUVar2);
        pUVar5 = (Unit *)CONCAT44(extraout_var,iVar3);
        if (pUVar2 != pUVar5) {
          if (pUVar5 == (Unit *)0x0) {
            if (pUVar1 == *units) {
              *units = (*units)->_tail;
              pUVar1->_head = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
              pUVar7 = (UnitList *)0x0;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pUVar1;
            }
            else {
              pUVar8->_tail = pUVar1->_tail;
              pUVar1->_head = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
              pUVar7 = pUVar8;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pUVar1;
            }
          }
          else {
            pUVar1->_head = pUVar5;
          }
        }
      }
      ppLVar4 = &pUVar7->_tail;
      bVar9 = pUVar7 == (UnitList *)0x0;
      ppLVar6 = ppLVar4;
      if (bVar9) {
        ppLVar6 = units;
      }
    } while (*ppLVar6 != (List<Kernel::Unit_*> *)0x0);
  }
  return;
}

Assistant:

bool hasNext()
    {
      if (_cur) { // there was an element previously returned by next()
	return _cur->tail() != 0;
      }
      return isNonEmpty(_lst);
    }